

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

int cargo_add_optionv(cargo_t ctx,cargo_option_flags_t flags,char *optnames,char *description,
                     char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  cargo_t pcVar2;
  int iVar3;
  int iVar4;
  cargo_bool_acc_op_t cVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  cargo_opt_t *pcVar11;
  size_t **ppsVar12;
  uint *puVar13;
  uint uVar14;
  size_t sVar15;
  undefined8 *puVar16;
  long lVar17;
  int *piVar18;
  size_t sVar19;
  char cVar20;
  ulong uVar21;
  int iVar22;
  cargo_opt_t *o;
  char *group;
  char *group_00;
  char *fmt_1;
  byte *pbVar23;
  byte *pbVar24;
  bool bVar25;
  char **groups;
  size_t optcount;
  char **optname_list;
  size_t count;
  char **local_70;
  size_t local_68;
  cargo_t local_60;
  byte *local_58;
  __va_list_tag *local_50;
  char **local_48;
  ulong local_40;
  char *local_38;
  
  local_68 = 0;
  local_48 = (char **)0x0;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1728,
                  "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                 );
  }
  if ((((flags >> 8 & 1) != 0) || ((ctx->flags & CARGO_DEFAULT_LITERALS) != 0)) &&
     ((ctx->flags & CARGO_AUTOCLEAN) == 0)) {
    return -1;
  }
  local_70 = (char **)0x0;
  local_58 = (byte *)fmt;
  local_50 = ap;
  local_38 = description;
  sVar6 = strspn(optnames," \t");
  pcVar10 = optnames + sVar6;
  if (optnames[sVar6] == '<') {
    pcVar7 = strchr(pcVar10,0x3e);
    if (pcVar7 != (char *)0x0) {
      pcVar8 = cargo_strndup(pcVar10 + 1,(long)(int)(pcVar7 + ~(ulong)pcVar10));
      if (pcVar8 != (char *)0x0) {
        local_70 = _cargo_split(pcVar8,",",&local_40);
        if (local_40 < 3 && local_70 != (char **)0x0) {
          group_00 = (char *)0x0;
          group = (char *)0x0;
          local_60 = ctx;
          if (local_40 != 0) {
            uVar21 = 0;
            do {
              pcVar9 = local_70[uVar21];
              sVar6 = strspn(pcVar9," \t");
              if (pcVar9[sVar6] == '!') {
                pcVar9 = _cargo_strdup(pcVar9 + sVar6 + 1);
                group = pcVar9;
              }
              else {
                pcVar9 = _cargo_strdup(pcVar9 + sVar6);
                group_00 = pcVar9;
              }
              if (pcVar9 == (char *)0x0) {
                pcVar10 = (char *)0x0;
                ctx = local_60;
                goto LAB_0010e192;
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < local_40);
          }
          pcVar10 = pcVar10 + (((long)(pcVar7 + ~(ulong)pcVar10) << 0x20) + 0x200000000 >> 0x20);
          ctx = local_60;
        }
        else {
          group_00 = (char *)0x0;
          group = (char *)0x0;
          pcVar10 = (char *)0x0;
        }
LAB_0010e192:
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(pcVar8);
        }
        else {
          (*replaced_cargo_free)(pcVar8);
        }
        if (pcVar10 == (char *)0x0) {
          if (group_00 != (char *)0x0) {
            if (replaced_cargo_free == (cargo_free_f)0x0) {
              free(group_00);
            }
            else {
              (*replaced_cargo_free)(group_00);
            }
            group_00 = (char *)0x0;
          }
          if (group != (char *)0x0) {
            if (replaced_cargo_free == (cargo_free_f)0x0) {
              free(group);
            }
            else {
              (*replaced_cargo_free)(group);
            }
            group = (char *)0x0;
          }
        }
        _cargo_free_str_list(&local_70,&local_40);
        goto LAB_0010e210;
      }
    }
    group_00 = (char *)0x0;
    group = (char *)0x0;
    pcVar10 = (char *)0x0;
  }
  else {
    group_00 = (char *)0x0;
    group = (char *)0x0;
  }
LAB_0010e210:
  if (pcVar10 == (char *)0x0) {
    return -1;
  }
  local_70 = (char **)0x0;
  pcVar10 = _cargo_strdup(pcVar10);
  if (pcVar10 == (char *)0x0) {
LAB_0010e2de:
    local_48 = (char **)0x0;
  }
  else {
    local_70 = _cargo_split(pcVar10," ",&local_68);
    if ((((local_70 == (char **)0x0) || (local_68 == 0)) ||
        (iVar3 = _cargo_find_option_name(ctx,*local_70,(size_t *)0x0,(size_t *)0x0), iVar3 == 0)) ||
       (((pcVar7 = *local_70, pcVar7 == (char *)0x0 ||
         (pcVar8 = strpbrk(pcVar7,ctx->prefix), pcVar8 != pcVar7)) &&
        (pcVar8 = strpbrk(pcVar7,"abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"),
        pcVar8 != pcVar7)))) {
      if (replaced_cargo_free == (cargo_free_f)0x0) {
        free(pcVar10);
      }
      else {
        (*replaced_cargo_free)(pcVar10);
      }
      _cargo_free_str_list(&local_70,&local_68);
      goto LAB_0010e2de;
    }
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar10);
      local_48 = local_70;
    }
    else {
      (*replaced_cargo_free)(pcVar10);
      local_48 = local_70;
    }
  }
  if (local_48 == (char **)0x0) {
LAB_0010e4bd:
    iVar3 = -1;
    bVar25 = true;
    o = (cargo_opt_t *)0x0;
    goto LAB_0010e4c0;
  }
  if (ctx->max_opts == 0) {
    __assert_fail("*max_opts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x44d,"int _cargo_grow_options(cargo_t, cargo_opt_t **, size_t *, size_t *)");
  }
  pcVar2 = (cargo_t)*local_48;
  if (ctx->options == (cargo_opt_t *)0x0) {
    pcVar11 = (cargo_opt_t *)_cargo_calloc(ctx->max_opts,0x128);
    ctx->options = pcVar11;
    if (pcVar11 != (cargo_opt_t *)0x0) goto LAB_0010e32e;
LAB_0010e47c:
    o = (cargo_opt_t *)0x0;
  }
  else {
LAB_0010e32e:
    uVar21 = ctx->max_opts;
    if (uVar21 <= ctx->opt_count) {
      ctx->max_opts = uVar21 * 2;
      if (replaced_cargo_realloc == (cargo_realloc_f)0x0) {
        pcVar11 = (cargo_opt_t *)realloc(ctx->options,uVar21 * 0x250);
      }
      else {
        pcVar11 = (cargo_opt_t *)(*replaced_cargo_realloc)(ctx->options,uVar21 * 0x250);
      }
      if (pcVar11 == (cargo_opt_t *)0x0) goto LAB_0010e47c;
      ctx->options = pcVar11;
      sVar15 = ctx->opt_count;
      if (sVar15 != 0) {
        ppsVar12 = &pcVar11->target_count;
        do {
          if ((cargo_custom_f)ppsVar12[-7] != (cargo_custom_f)0x0) {
            ppsVar12[-2] = (size_t *)(ppsVar12 + -4);
            *ppsVar12 = (size_t *)(ppsVar12 + -3);
          }
          ppsVar12 = ppsVar12 + 0x25;
          sVar15 = sVar15 - 1;
        } while (sVar15 != 0);
      }
    }
    pcVar11 = ctx->options;
    sVar15 = ctx->opt_count;
    o = pcVar11 + sVar15;
    local_60 = pcVar2;
    memset(o,0,0x128);
    ctx->opt_count = ctx->opt_count + 1;
    if (pcVar11[sVar15].name_count < 4) {
      pcVar10 = _cargo_strdup((char *)local_60);
      if (pcVar10 == (char *)0x0) {
        o = (cargo_opt_t *)0x0;
      }
      else {
        sVar15 = o->name_count;
        o->name[sVar15] = pcVar10;
        o->name_count = sVar15 + 1;
        if (local_38 != (char *)0x0) {
          pcVar10 = _cargo_strdup(local_38);
          o->description = pcVar10;
          if (pcVar10 == (char *)0x0) goto LAB_0010e47c;
        }
      }
    }
    else {
      o = (cargo_opt_t *)0x0;
    }
  }
  iVar3 = -1;
  bVar25 = true;
  if (o == (cargo_opt_t *)0x0) goto LAB_0010e4bd;
  if (group_00 == (char *)0x0) {
    o->group_index = -1;
  }
  else {
    iVar4 = _cargo_group_add_option_ex(ctx,ctx->groups,ctx->group_count,group_00,o->name[0],0);
    if (iVar4 != 0) goto LAB_0010e4c0;
  }
  if ((group != (char *)0x0) &&
     (iVar4 = _cargo_group_add_option_ex
                        (ctx,ctx->mutex_groups,ctx->mutex_group_count,group,o->name[0],1),
     iVar4 != 0)) goto LAB_0010e4c0;
  iVar4 = 2;
  pbVar24 = local_58;
  while( true ) {
    pbVar23 = pbVar24 + 1;
    bVar1 = *pbVar24;
    if ((bVar1 != 0x20) && (bVar1 != 9)) break;
    iVar4 = iVar4 + 1;
    pbVar24 = pbVar23;
  }
  if (bVar1 == 0x2e) {
    o->alloc = 0;
    pbVar24 = pbVar23;
    while( true ) {
      pbVar23 = pbVar24 + 1;
      bVar1 = *pbVar24;
      if ((bVar1 != 0x20) && (bVar1 != 9)) break;
      iVar4 = iVar4 + 1;
      pbVar24 = pbVar23;
    }
  }
  else {
    iVar4 = iVar4 + -1;
    o->alloc = 1;
  }
  if (bVar1 == 0x5b) {
    o->array = 1;
    pbVar24 = pbVar23;
    do {
      do {
        iVar4 = iVar4 + 1;
        pbVar23 = pbVar24 + 1;
        bVar1 = *pbVar24;
        pbVar24 = pbVar23;
      } while (bVar1 == 0x20);
    } while (bVar1 == 9);
  }
  iVar22 = iVar4;
  if (bVar1 < 0x62) {
    if (bVar1 != 0x44) {
      if (bVar1 == 0x4c) {
        o->type = CARGO_LONGLONG;
      }
      else {
        if (bVar1 != 0x55) goto switchD_0010e606_caseD_65;
        o->type = CARGO_ULONGLONG;
      }
      goto LAB_0010e732;
    }
    o->array = 0;
    o->alloc = 1;
    o->type = CARGO_STRING;
    o->nargs = 0;
    o->lenstr = 0;
    o->custom = (cargo_custom_f)0x0;
    o->custom_user = (void *)0x0;
    o->target = &o->custom_target;
    o->target_count = &o->custom_target_count;
LAB_0010eaac:
    bVar25 = false;
    iVar22 = iVar4;
  }
  else {
    switch(bVar1) {
    case 0x62:
      o->type = CARGO_BOOL;
      uVar14 = local_50->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar14 + (long)local_50->reg_save_area);
        local_50->gp_offset = uVar14 + 8;
      }
      else {
        puVar16 = (undefined8 *)local_50->overflow_arg_area;
        local_50->overflow_arg_area = puVar16 + 1;
      }
      o->target = (void **)*puVar16;
      pbVar24 = pbVar23;
      do {
        do {
          iVar22 = iVar22 + 1;
          pbVar23 = pbVar24 + 1;
          bVar1 = *pbVar24;
          pbVar24 = pbVar23;
        } while (bVar1 == 0x20);
      } while (bVar1 == 9);
      if (bVar1 < 0x3d) {
        if (bVar1 == 0x21) {
          o->bool_count = 1;
LAB_0010ee52:
          bVar25 = true;
          goto LAB_0010e762;
        }
        if (bVar1 == 0x26) {
          cVar5 = CARGO_BOOL_OP_AND;
        }
        else {
          if (bVar1 != 0x2b) {
LAB_0010ed49:
            o->bool_store = 1;
            o->bool_count = 0;
            o->bool_acc = (int *)0x0;
            goto LAB_0010ed5f;
          }
          cVar5 = CARGO_BOOL_OP_PLUS;
        }
      }
      else if (bVar1 == 0x7c) {
        cVar5 = CARGO_BOOL_OP_OR;
      }
      else {
        if (bVar1 != 0x5f) {
          if (bVar1 != 0x3d) goto LAB_0010ed49;
          uVar14 = local_50->gp_offset;
          if ((ulong)uVar14 < 0x29) {
            piVar18 = (int *)((ulong)uVar14 + (long)local_50->reg_save_area);
            local_50->gp_offset = uVar14 + 8;
          }
          else {
            piVar18 = (int *)local_50->overflow_arg_area;
            local_50->overflow_arg_area = piVar18 + 2;
          }
          o->bool_store = *piVar18;
          goto LAB_0010ee52;
        }
        cVar5 = CARGO_BOOL_OP_STORE;
      }
      o->bool_acc_op = cVar5;
      o->bool_acc_count = 0;
      uVar14 = local_50->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar13 = (uint *)((ulong)uVar14 + (long)local_50->reg_save_area);
        local_50->gp_offset = uVar14 + 8;
      }
      else {
        puVar13 = (uint *)local_50->overflow_arg_area;
        local_50->overflow_arg_area = puVar13 + 2;
      }
      uVar14 = *puVar13;
      o->bool_acc_max_count = (ulong)uVar14;
      piVar18 = (int *)_cargo_calloc((ulong)uVar14,4);
      o->bool_acc = piVar18;
      if (piVar18 != (int *)0x0) {
        bVar25 = true;
        if (o->bool_acc_max_count != 0) {
          uVar21 = 0;
          do {
            uVar14 = local_50->gp_offset;
            if ((ulong)uVar14 < 0x29) {
              piVar18 = (int *)((ulong)uVar14 + (long)local_50->reg_save_area);
              local_50->gp_offset = uVar14 + 8;
            }
            else {
              piVar18 = (int *)local_50->overflow_arg_area;
              local_50->overflow_arg_area = piVar18 + 2;
            }
            o->bool_acc[uVar21] = *piVar18;
            uVar21 = uVar21 + 1;
          } while (uVar21 < o->bool_acc_max_count);
        }
        goto LAB_0010e762;
      }
      goto LAB_0010ec5d;
    case 99:
      if (o->alloc == 0) {
        o->alloc = 1;
      }
      o->type = CARGO_STRING;
      uVar14 = local_50->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar14 + (long)local_50->reg_save_area);
        local_50->gp_offset = uVar14 + 8;
      }
      else {
        puVar16 = (undefined8 *)local_50->overflow_arg_area;
        local_50->overflow_arg_area = puVar16 + 1;
      }
      o->custom = (cargo_custom_f)*puVar16;
      uVar14 = local_50->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar14 + (long)local_50->reg_save_area);
        local_50->gp_offset = uVar14 + 8;
      }
      else {
        puVar16 = (undefined8 *)local_50->overflow_arg_area;
        local_50->overflow_arg_area = puVar16 + 1;
      }
      o->custom_user = (void *)*puVar16;
      o->target = &o->custom_target;
      o->target_count = &o->custom_target_count;
      o->lenstr = 0;
      pbVar24 = pbVar23;
      do {
        do {
          iVar22 = iVar22 + 1;
          pbVar23 = pbVar24 + 1;
          bVar1 = *pbVar24;
          pbVar24 = pbVar23;
        } while (bVar1 == 9);
      } while (bVar1 == 0x20);
      if (bVar1 != 0x30) {
        pbVar23 = local_58 + iVar4;
        o->nargs = 1;
        goto LAB_0010eaac;
      }
      o->nargs = 0;
      bVar25 = false;
      goto LAB_0010e762;
    case 100:
      o->type = CARGO_DOUBLE;
      break;
    case 0x65:
    case 0x67:
    case 0x68:
      goto switchD_0010e606_caseD_65;
    case 0x66:
      o->type = CARGO_FLOAT;
      break;
    case 0x69:
      o->type = CARGO_INT;
      break;
    default:
      if (bVar1 != 0x73) {
        if (bVar1 == 0x75) {
          o->type = CARGO_UINT;
          break;
        }
        goto switchD_0010e606_caseD_65;
      }
      o->type = CARGO_STRING;
      uVar14 = local_50->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar16 = (undefined8 *)((ulong)uVar14 + (long)local_50->reg_save_area);
        local_50->gp_offset = uVar14 + 8;
      }
      else {
        puVar16 = (undefined8 *)local_50->overflow_arg_area;
        local_50->overflow_arg_area = puVar16 + 1;
      }
      o->target = (void **)*puVar16;
      pbVar24 = pbVar23;
      do {
        do {
          iVar22 = iVar22 + 1;
          pbVar23 = pbVar24 + 1;
          bVar1 = *pbVar24;
          pbVar24 = pbVar23;
        } while (bVar1 == 0x20);
      } while (bVar1 == 9);
      if (bVar1 == 0x23) {
        uVar14 = local_50->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          piVar18 = (int *)((ulong)uVar14 + (long)local_50->reg_save_area);
          local_50->gp_offset = uVar14 + 8;
        }
        else {
          piVar18 = (int *)local_50->overflow_arg_area;
          local_50->overflow_arg_area = piVar18 + 2;
        }
        o->lenstr = (long)*piVar18;
        goto LAB_0010ee52;
      }
      o->lenstr = 0;
LAB_0010ed5f:
      pbVar23 = local_58 + iVar4;
      goto LAB_0010e75e;
    }
LAB_0010e732:
    uVar14 = local_50->gp_offset;
    if ((ulong)uVar14 < 0x29) {
      puVar16 = (undefined8 *)((ulong)uVar14 + (long)local_50->reg_save_area);
      local_50->gp_offset = uVar14 + 8;
    }
    else {
      puVar16 = (undefined8 *)local_50->overflow_arg_area;
      local_50->overflow_arg_area = puVar16 + 1;
    }
    o->target = (void **)*puVar16;
LAB_0010e75e:
    bVar25 = true;
    iVar22 = iVar4;
  }
LAB_0010e762:
  if (o->array == 0) {
    pbVar24 = pbVar23;
    if (o->type == CARGO_BOOL) {
      o->nargs = 0;
    }
    else {
      do {
        do {
          pbVar23 = pbVar24 + 1;
          bVar1 = *pbVar24;
          pbVar24 = pbVar23;
        } while (bVar1 == 0x20);
      } while (bVar1 == 9);
      if (bVar1 == 0x3f) {
        o->nargs = -3;
        uVar14 = local_50->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          puVar16 = (undefined8 *)((ulong)uVar14 + (long)local_50->reg_save_area);
          local_50->gp_offset = uVar14 + 8;
        }
        else {
          puVar16 = (undefined8 *)local_50->overflow_arg_area;
          local_50->overflow_arg_area = puVar16 + 1;
        }
        o->zero_or_one_default = (char *)*puVar16;
      }
      else {
        pbVar23 = local_58 + iVar22;
        if (bVar25) {
          o->nargs = 1;
        }
      }
    }
    iVar4 = 0;
    if (o->type == CARGO_STRING) {
      iVar4 = o->alloc;
    }
    o->alloc = iVar4;
    o->max_target_count = 1;
    goto LAB_0010eb91;
  }
  uVar14 = local_50->gp_offset;
  if (o->custom == (cargo_custom_f)0x0) {
    if (uVar14 < 0x29) {
      puVar16 = (undefined8 *)((ulong)uVar14 + (long)local_50->reg_save_area);
      local_50->gp_offset = uVar14 + 8;
    }
    else {
      puVar16 = (undefined8 *)local_50->overflow_arg_area;
      local_50->overflow_arg_area = puVar16 + 1;
    }
    lVar17 = 0xb8;
  }
  else {
    if (uVar14 < 0x29) {
      puVar16 = (undefined8 *)((long)local_50->reg_save_area + (ulong)uVar14);
      local_50->gp_offset = uVar14 + 8;
    }
    else {
      puVar16 = (undefined8 *)local_50->overflow_arg_area;
      local_50->overflow_arg_area = puVar16 + 1;
    }
    lVar17 = 0x90;
  }
  bVar25 = true;
  *(undefined8 *)((long)o->name + lVar17) = *puVar16;
  for (pbVar23 = pbVar23 + 2; (bVar1 = pbVar23[-2], bVar1 == 9 || (bVar1 == 0x20));
      pbVar23 = pbVar23 + 1) {
  }
  if (bVar1 != 0x5d) goto LAB_0010e4c0;
  for (; (bVar1 = pbVar23[-1], bVar1 == 0x20 || (bVar1 == 9)); pbVar23 = pbVar23 + 1) {
  }
  if (o->alloc == 0) {
    if (*local_58 != 0x2e) {
      __assert_fail("*fmt == \'.\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x1860,
                    "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                   );
    }
    uVar14 = local_50->gp_offset;
    if ((ulong)uVar14 < 0x29) {
      piVar18 = (int *)((ulong)uVar14 + (long)local_50->reg_save_area);
      local_50->gp_offset = uVar14 + 8;
    }
    else {
      piVar18 = (int *)local_50->overflow_arg_area;
      local_50->overflow_arg_area = piVar18 + 2;
    }
    iVar4 = *piVar18;
    o->max_target_count = (long)iVar4;
    if (bVar1 < 0x2b) {
      if (bVar1 == 0x23) {
LAB_0010e96d:
        o->nargs = iVar4;
      }
      else {
        if (bVar1 != 0x2a) goto switchD_0010e606_caseD_65;
        o->nargs = -2;
      }
    }
    else {
      if (bVar1 != 0x2b) {
        if (bVar1 != 0x4e) goto switchD_0010e606_caseD_65;
        goto LAB_0010e96d;
      }
      o->nargs = -1;
    }
LAB_0010eb91:
    for (; (bVar1 = *pbVar23, bVar1 == 9 || (bVar1 == 0x20)); pbVar23 = pbVar23 + 1) {
    }
    if (bVar1 == 0) {
      o->flags = flags;
      o->first_parse = 1;
      cVar20 = *o->name[0];
      pcVar10 = ctx->prefix;
      sVar6 = strlen(pcVar10);
      if (sVar6 == 0) {
        bVar25 = true;
      }
      else {
        sVar19 = 0;
        do {
          if (pcVar10[sVar19] == cVar20) goto LAB_0010ebf0;
          sVar19 = sVar19 + 1;
        } while (sVar6 != sVar19);
        cVar20 = '\0';
LAB_0010ebf0:
        bVar25 = cVar20 == '\0';
      }
      o->positional = (uint)bVar25;
      if ((((flags & CARGO_OPT_NOT_REQUIRED) == 0) && (bVar25 != false)) && (1 < o->nargs + 3U)) {
        o->flags = flags | CARGO_OPT_REQUIRED;
      }
      iVar4 = o->nargs;
      if ((iVar4 < -3) ||
         ((o->custom == (cargo_custom_f)0x0 &&
          ((o->target == (void **)0x0 ||
           ((o->target_count == (size_t *)0x0 && (iVar4 == -1 || 1 < iVar4)))))))) {
LAB_0010ec5d:
        bVar25 = true;
      }
      else {
        if ((iVar4 != 1) && (((o->type == CARGO_STRING && (o->lenstr == 0)) && (o->alloc == 0)))) {
          o->str_alloc_items = 1;
        }
        if (local_68 < 2) {
          bVar25 = false;
          iVar3 = 0;
        }
        else {
          uVar21 = 1;
          do {
            iVar4 = cargo_add_alias(ctx,*local_48,local_48[uVar21]);
            bVar25 = iVar4 != 0;
            if (bVar25) goto LAB_0010e4c0;
            uVar21 = uVar21 + 1;
          } while (uVar21 < local_68);
          iVar3 = 0;
        }
      }
      goto LAB_0010e4c0;
    }
  }
  else {
    if (bVar1 < 0x2b) {
      if (bVar1 == 0x23) {
LAB_0010e904:
        uVar14 = local_50->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          puVar13 = (uint *)((ulong)uVar14 + (long)local_50->reg_save_area);
          local_50->gp_offset = uVar14 + 8;
        }
        else {
          puVar13 = (uint *)local_50->overflow_arg_area;
          local_50->overflow_arg_area = puVar13 + 2;
        }
        uVar14 = *puVar13;
      }
      else {
        uVar14 = 0xfffffffe;
        if (bVar1 != 0x2a) goto switchD_0010e606_caseD_65;
      }
LAB_0010eb60:
      o->nargs = uVar14;
      uVar21 = 0xffffffffffffffff;
      if (-1 < (int)uVar14) {
        uVar21 = (ulong)uVar14;
      }
      o->max_target_count = uVar21;
      goto LAB_0010eb91;
    }
    if (bVar1 == 0x4e) goto LAB_0010e904;
    if (bVar1 == 0x2b) {
      uVar14 = 0xffffffff;
      goto LAB_0010eb60;
    }
  }
switchD_0010e606_caseD_65:
  bVar25 = true;
  if (o->name[0] == (char *)0x0) {
    __assert_fail("optname",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1087,
                  "void _cargo_invalid_format_char(cargo_t, const char *, const char *, cargo_fmt_scanner_t *)"
                 );
  }
LAB_0010e4c0:
  if ((bVar25) && (o != (cargo_opt_t *)0x0)) {
    _cargo_option_destroy(o);
    ctx->opt_count = ctx->opt_count - 1;
  }
  if (group_00 != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(group_00);
    }
    else {
      (*replaced_cargo_free)(group_00);
    }
  }
  if (group != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(group);
    }
    else {
      (*replaced_cargo_free)(group);
    }
  }
  _cargo_free_str_list(&local_48,&local_68);
  return iVar3;
}

Assistant:

int cargo_add_optionv(cargo_t ctx, cargo_option_flags_t flags,
                         const char *optnames, const char *description,
                         const char *fmt, va_list ap)
{
    size_t optcount = 0;
    char **optname_list = NULL;
    int ret = -1;
    size_t i = 0;
    cargo_fmt_scanner_t s;
    cargo_opt_t *o = NULL;
    char *grpname = NULL;
    char *mutex_grpname = NULL;
    int nargs_is_set = 0;
    assert(ctx);

    CARGODBG(2, "-------- Add option \"%s\", \"%s\" --------\n", optnames, fmt);

    if ((
            (flags & CARGO_OPT_DEFAULT_LITERAL) ||
            (ctx->flags & CARGO_DEFAULT_LITERALS)
        )
        && !(ctx->flags & CARGO_AUTOCLEAN))
    {
        CARGODBG(1, "Option flag CARGO_OPT_DEFAULT_LITERAL or global flag "
                    "CARGO_DEFAULT_LITERALS must be "
                    "combined with the global flag CARGO_AUTOCLEAN "
                    "to avoid memory leak / crash.");
        return -1;
    }

    // TODO: Allow multiple mutex groups...
    if (!(optnames = _cargo_get_option_group_names(ctx, optnames,
                        &grpname, &mutex_grpname)))
    {
        CARGODBG(1, "Failed to parse group name\n");
        return -1;
    }

    CARGODBG(2, " Group: \"%s\", Optnames: \"%s\"\n", grpname, optnames);

    if (!(optname_list = _cargo_split_and_verify_option_names(ctx, optnames, &optcount)))
    {
        CARGODBG(1, "Failed to split option names \"%s\"\n", optnames);
        goto fail;
    }

    if (!(o = _cargo_option_init(ctx, optname_list[0], description)))
    {
        CARGODBG(1, "Failed to init option\n");
        goto fail;
    }

    if (grpname)
    {
        CARGODBG(2, "Add \"%s\" to group \"%s\"\n", o->name[0], grpname);

        if (cargo_group_add_option(ctx, grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to group \"%s\"\n",
                    o->name[0], grpname);
            goto fail;
        }
    }
    else
    {
        CARGODBG(2, "Add \"%s\" to default group\n", o->name[0]);
        o->group_index = -1;
    }

    if (mutex_grpname)
    {
        CARGODBG(2, "Add \"%s\" to mutex group \"%s\"\n", o->name[0], mutex_grpname);

        if (cargo_mutex_group_add_option(ctx, mutex_grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to mutex group \"%s\"",
                    o->name[0], mutex_grpname);
            goto fail;
        }
    }

    // Start parsing the format string.
    _cargo_fmt_scanner_init(&s, fmt);
    _cargo_fmt_next_token(&s);

    // Get the first token.
    if (_cargo_fmt_token(&s) == '.')
    {
        CARGODBG(2, "Static\n");
        o->alloc = 0;
        _cargo_fmt_next_token(&s);
    }
    else
    {
        o->alloc = 1;
    }

    if (_cargo_fmt_token(&s) == '[')
    {
        CARGODBG(4, "   [\n");
        o->array = 1;
        _cargo_fmt_next_token(&s);
    }

    switch (_cargo_fmt_token(&s))
    {
        //
        // !!!WARNING!!!
        // Do not attempt to refactor and put these longer cases in
        // separate functions. Passing a va_list around is dangerous.
        // This works fine on Unix, but fails randomly on Windows!
        //

        // Same as string, but the target is internal
        // and will be passed to the user specified callback.
        case 'c':
        {
            CARGODBG(4, "Custom callback\n");

            if (!o->alloc)
            {
                CARGODBG(1, "WARNING! Static '.' is ignored for a custom "
                            "callback the memory for the arguments is "
                            "allocated internally.");
                o->alloc = 1;
            }

            o->type = CARGO_STRING;
            o->custom = va_arg(ap, cargo_custom_f);
            o->custom_user = va_arg(ap, void *);

            // We use an internal target for custom variables, this will then
            // be passed on to the callback as argv and argc.
            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            o->lenstr = 0;

            if (!o->custom)
            {
                CARGODBG(2, "Warning: Got NULL custom callback pointer\n");
            }

            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // A shortcut to "[c]#", cbfunc, NULL, NULL, 0.
                // which makes a custom callback a bool flag basically.
                case '0': o->nargs = 0; break;
                default:
                {
                    _cargo_fmt_prev_token(&s);
                    o->nargs = 1;
                    break;
                }
            }

            nargs_is_set = 1;

            break;
        }
        case 'D': // D as in Dummy.
        {
            // Shortcut for: "c0", NULL, NULL;
            // That is a dummy callback. This is mostly useful
            // for using in a mutex group.
            o->array = 0;
            o->alloc = 1;
            o->type = CARGO_STRING;
            o->custom = NULL;
            o->custom_user = NULL;
            o->lenstr = 0;
            o->nargs = 0;

            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            nargs_is_set = 1;
            break;
        }
        case 's':
        {
            o->type = CARGO_STRING;
            o->target = (void *)va_arg(ap, char *);

            CARGODBG(4, "Read string\n");
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '#')
            {
                o->lenstr = (size_t)va_arg(ap, int);
                CARGODBG(4, "String length: %lu\n", o->lenstr);

                if (o->alloc)
                {
                    CARGODBG(1, "%s: WARNING! Usually restricting the size of a "
                        "string using # is only done on static strings.\n"
                        "    Are you sure you want this?\n",
                        o->name[0]);
                    CARGODBG(1, "      \"%s\"\n", s.start);
                    CARGODBG(1, "       %*s\n", s.column, "^");
                }
            }
            else
            {
                // String size not fixed.
                o->lenstr = 0;
                _cargo_fmt_prev_token(&s);
            }

            break;
        }
        case 'b':
        {
            o->type = CARGO_BOOL;
            o->target = va_arg(ap, void *);

            // Look for any modifier tokens.
            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // Read an int that will be stored in the bool value (Default 1)
                case '=': o->bool_store = va_arg(ap, int); break;
                // Count flag occurances.
                case '!': o->bool_count = 1; break;
                case '|':
                case '+':
                case '&':
                case '_':
                {
                    switch (_cargo_fmt_token(&s))
                    {
                        default:
                        case '|': o->bool_acc_op = CARGO_BOOL_OP_OR; break;
                        case '+': o->bool_acc_op = CARGO_BOOL_OP_PLUS; break;
                        case '&': o->bool_acc_op = CARGO_BOOL_OP_AND; break;
                        case '_': o->bool_acc_op = CARGO_BOOL_OP_STORE; break;
                    }

                    o->bool_acc_count = 0;
                    o->bool_acc_max_count = (size_t)va_arg(ap, unsigned int);
                    CARGODBG(3, "Bool acc max count %lu\n", o->bool_acc_max_count);

                    if (!(o->bool_acc = _cargo_calloc(o->bool_acc_max_count, sizeof(int))))
                    {
                        CARGODBG(1, "Out of memory\n");
                        goto fail;
                    }

                    for (i = 0; i < o->bool_acc_max_count; i++)
                    {
                        o->bool_acc[i] = va_arg(ap, int);
                        CARGODBG(3, "  bool acc value %lu: 0x%x\n", i, o->bool_acc[i]);
                    }
                    break;
                }
                default:
                {
                    // Got no flag modifier token.
                    o->bool_store = 1;
                    o->bool_count = 0;
                    o->bool_acc = NULL;
                    _cargo_fmt_prev_token(&s);
                }
            }

            break;
        }
        // TODO: Maybe replace target here with a union?
        case 'i': o->type = CARGO_INT;    o->target = va_arg(ap, void *); break;
        case 'd': o->type = CARGO_DOUBLE; o->target = va_arg(ap, void *); break;
        case 'u': o->type = CARGO_UINT;   o->target = va_arg(ap, void *); break;
        case 'f': o->type = CARGO_FLOAT;  o->target = va_arg(ap, void *); break;
        case 'L': o->type = CARGO_LONGLONG;   o->target = va_arg(ap, void *); break;
        case 'U': o->type = CARGO_ULONGLONG;  o->target = va_arg(ap, void *); break;
        default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);goto fail;
    }

    if (o->array)
    {
        // Custom callbacks uses an internal target and count.
        // However we still return the count in a separate
        // user specified value for arrays.
        if (o->custom)
        {
            o->custom_user_count = va_arg(ap, size_t *);
        }
        else
        {
            // This is where we return the number of arguments
            // we have parsed for this option.
            o->target_count = va_arg(ap, size_t *);
        }

        _cargo_fmt_next_token(&s);

        if (_cargo_fmt_token(&s) != ']')
        {
            CARGODBG(1, "%s: Expected ']'\n", o->name[0]);
            CARGODBG(1, "      \"%s\"\n", fmt);
            CARGODBG(1, "        %*s\n", s.column, "^");
            goto fail;
        }

        _cargo_fmt_next_token(&s);

        if (o->alloc)
        {
            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = va_arg(ap, int); break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }

            // By default "nargs" is the max number of arguments the option should parse.
            o->max_target_count = (o->nargs >= 0) ? o->nargs : (size_t)(-1);
        }
        else
        {
            assert(*fmt == '.');
            // If we have a static array. For example:
            // "int val[4];"
            // The max target count must still always be specified
            // if we use "+" or "*" when in static mode.
            o->max_target_count = va_arg(ap, int);

            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = o->max_target_count; break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }
        }
    }
    else
    {
        // Non-array.

        if (o->type == CARGO_BOOL)
        {
            // BOOLs never have arguments.
            o->nargs = 0;
        }
        else
        {
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '?')
            {
                o->nargs = CARGO_NARGS_ZERO_OR_ONE;
                o->zero_or_one_default = va_arg(ap, char *);
            }
            else
            {
                _cargo_fmt_prev_token(&s);

                if (!nargs_is_set)
                {
                    o->nargs = 1;
                }
            }
        }

        // Never allocate single values (unless it's a string).
        o->alloc = (o->type != CARGO_STRING) ? 0 : o->alloc;
        o->max_target_count = 1;
    }

    _cargo_fmt_next_token(&s);

    if (_cargo_fmt_token(&s) != '\0')
    {
        _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
        CARGODBG(1, "Got garbage at end of format string\n");
        goto fail;
    }

    o->flags = flags;
    o->first_parse = 1;

    // Check if the option has a prefix
    // (if not it's positional).
    o->positional = !_cargo_is_prefix(ctx, o->name[0][0]);

    if (o->positional
        && !(o->flags & CARGO_OPT_NOT_REQUIRED)
        && (o->nargs != CARGO_NARGS_ZERO_OR_MORE)
        && (o->nargs != CARGO_NARGS_ZERO_OR_ONE))
    {
        CARGODBG(2, "Positional argument %s required by default\n", o->name[0]);
        o->flags |= CARGO_OPT_REQUIRED;
    }

    if (_cargo_validate_option_args(ctx, o))
    {
        goto fail;
    }

    // .[s]#  .[s]+  .[s]*
    if ((o->type == CARGO_STRING)
         && (o->nargs != 1)
         && (o->lenstr == 0)
         && !o->alloc)
    {
        // A list of strings with a static size is a special case:
        //   char *strs[5];
        // Since we only want to allocate memory for the individual
        // strings we parse, but not the entire list (as with):
        //   char **strs;
        // The format string for this would be ".[s]#"
        //
        // nargs != 1 && nargs != -1:
        //   So we want nargs to be set, but not to infinite (-1),
        //   this means # was used.
        // lenstr == 0:
        //   .[s#]# would mean we have something like char strs[5][15];
        // !alloc:
        //   The list is not to be allocated.

        // So in this case we are not allocating the list itself
        // since that is of a fixed size. But we want to allocate
        // each individual item string.
        o->str_alloc_items = 1;
    }

    for (i = 1; i < optcount; i++)
    {
        if (cargo_add_alias(ctx, optname_list[0], optname_list[i]))
        {
            goto fail;
        }
    }

    CARGODBG(2, " Option %s:\n", o->name[0]);
    CARGODBG(2, "   max_target_count = %lu\n", o->max_target_count);
    CARGODBG(2, "   alloc = %d\n", o->alloc);
    CARGODBG(2, "   lenstr = %lu\n", o->lenstr);
    CARGODBG(2, "   nargs = %d\n", o->nargs);
    CARGODBG(2, "   positional = %d\n", o->positional);
    CARGODBG(2, "   array = %d\n", o->array);
    CARGODBG(2, "   \n");

    ret = 0;

fail:
    if (ret < 0)
    {
        if (o)
        {
            _cargo_option_destroy(o);
            ctx->opt_count--;
        }
    }

    _cargo_xfree(&grpname);
    _cargo_xfree(&mutex_grpname);
    _cargo_free_str_list(&optname_list, &optcount);

    return ret;
}